

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O3

void coda_url_preunescape(char *s,char *dest,size_t sz)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  char xnum_1 [3];
  char xnum [3];
  char local_46;
  char local_45;
  undefined1 local_44;
  char local_43;
  char local_42;
  undefined1 local_41;
  char *local_40;
  size_t local_38;
  
  cVar6 = *s;
  local_40 = dest;
  if (sz == 0xfffffffffffffffb || cVar6 == '\0') {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    local_38 = sz;
    do {
      if (cVar6 == '\\') {
        if (s[1] == 'x') {
          cVar1 = s[2];
          iVar3 = isxdigit((int)cVar1);
          if (iVar3 != 0) {
            cVar2 = s[3];
            iVar3 = isxdigit((int)cVar2);
            if (iVar3 != 0) {
              local_44 = 0;
              local_46 = cVar1;
              local_45 = cVar2;
              lVar4 = strtol(&local_46,(char **)0x0,0x10);
              if ((char)lVar4 < '\0') {
                local_40[uVar5] = (char)lVar4;
                uVar5 = uVar5 + 1;
              }
              else if (uVar5 + 3 < local_38) {
                *(undefined4 *)(local_40 + uVar5) = *(undefined4 *)s;
              }
              s = s + 4;
              goto LAB_001041b5;
            }
          }
        }
LAB_001041a6:
        local_40[uVar5] = cVar6;
        uVar5 = uVar5 + 1;
        s = s + 1;
      }
      else {
        if (cVar6 != '%') goto LAB_001041a6;
        cVar1 = s[1];
        iVar3 = isxdigit((int)cVar1);
        if (iVar3 == 0) goto LAB_001041a6;
        cVar2 = s[2];
        iVar3 = isxdigit((int)cVar2);
        if (iVar3 == 0) goto LAB_001041a6;
        local_41 = 0;
        local_43 = cVar1;
        local_42 = cVar2;
        lVar4 = strtol(&local_43,(char **)0x0,0x10);
        if ((char)lVar4 < '\0') {
          local_40[uVar5] = (char)lVar4;
          lVar4 = 1;
        }
        else {
          lVar4 = 3;
          if (uVar5 + 4 < local_38) {
            local_40[uVar5 + 2] = s[2];
            *(undefined2 *)(local_40 + uVar5) = *(undefined2 *)s;
          }
        }
        uVar5 = uVar5 + lVar4;
        s = s + 3;
      }
LAB_001041b5:
      cVar6 = *s;
    } while ((cVar6 != '\0') && (uVar5 < sz + 5));
  }
  local_40[uVar5] = '\0';
  return;
}

Assistant:

void coda_url_preunescape(const char* s, char* dest, size_t sz)
{
	size_t ptr = 0;
	while (*s && (ptr < sz + 5))
	{
		if ((*s == '%') && isxdigit(s[1]) && isxdigit(s[2]))
		{
			char xnum[3];
			xnum[0] = s[1];
			xnum[1] = s[2];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 4 < sz) memcpy(dest + ptr, s, 3);
				ptr += 3;
			}
			s += 3;
		}
		else if ((*s == '\\') && (s[1] == 'x') && isxdigit(s[2]) && isxdigit(s[3]))
		{
			char xnum[3];
			xnum[0] = s[2];
			xnum[1] = s[3];
			xnum[2] = 0;
			uint8_t c = strtol(xnum, 0, 16);
			if (c & 0x80)
			{
				dest[ptr] = (char)c;
				ptr++;
			}
			else
			{
				if (ptr + 3 < sz) memcpy(dest + ptr, s, 4);
			}
			s += 4;
		}
		else
		{
			dest[ptr] = *s;
			ptr++;
			s++;
		}
	}
	dest[ptr] = 0;
}